

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

Poll * __thiscall Poll::subscribe_alarm(Poll *this,shared_ptr<Alarm> *alarm)

{
  element_type *this_00;
  mapped_type *this_01;
  uint64_t local_20;
  shared_ptr<Alarm> *local_18;
  shared_ptr<Alarm> *alarm_local;
  Poll *this_local;
  
  local_18 = alarm;
  alarm_local = (shared_ptr<Alarm> *)this;
  this_00 = std::__shared_ptr_access<Alarm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Alarm,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)alarm
                      );
  local_20 = Alarm::get_timeout_time(this_00);
  this_01 = std::
            map<unsigned_long,_std::shared_ptr<Alarm>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>_>
            ::operator[](&this->alarms,&local_20);
  std::shared_ptr<Alarm>::operator=(this_01,alarm);
  return this;
}

Assistant:

Poll &Poll::subscribe_alarm(std::shared_ptr<Alarm> alarm) {
  this->alarms[alarm->get_timeout_time()] = alarm;
  return *this;
}